

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

void __thiscall
winmd::reader::table_base::set_columns
          (table_base *this,uint8_t a,uint8_t b,uint8_t c,uint8_t d,uint8_t e,uint8_t f)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  undefined3 in_register_00000011;
  uint8_t in_stack_00000008;
  
  uVar3 = c + a + b;
  uVar2 = uVar3 + d;
  uVar1 = uVar2 + e;
  this->m_row_size = uVar1 + in_stack_00000008;
  (this->m_columns)._M_elems[0].offset = '\0';
  (this->m_columns)._M_elems[0].size = a;
  if (CONCAT31(in_register_00000011,b) != 0) {
    (this->m_columns)._M_elems[1].offset = a;
    (this->m_columns)._M_elems[1].size = b;
  }
  if (c != '\0') {
    (this->m_columns)._M_elems[2].offset = a + b;
    (this->m_columns)._M_elems[2].size = c;
  }
  if (d != '\0') {
    (this->m_columns)._M_elems[3].offset = uVar3;
    (this->m_columns)._M_elems[3].size = d;
  }
  if (e != '\0') {
    (this->m_columns)._M_elems[4].offset = uVar2;
    (this->m_columns)._M_elems[4].size = e;
  }
  if (in_stack_00000008 != '\0') {
    (this->m_columns)._M_elems[5].offset = uVar1;
    (this->m_columns)._M_elems[5].size = in_stack_00000008;
  }
  return;
}

Assistant:

void set_columns(uint8_t const a, uint8_t const b = 0, uint8_t const c = 0, uint8_t const d = 0, uint8_t const e = 0, uint8_t const f = 0) noexcept
        {
            XLANG_ASSERT(a);
            XLANG_ASSERT(a <= 8);
            XLANG_ASSERT(b <= 8);
            XLANG_ASSERT(c <= 8);
            XLANG_ASSERT(d <= 8);
            XLANG_ASSERT(e <= 8);
            XLANG_ASSERT(f <= 8);

            XLANG_ASSERT(!m_row_size);
            m_row_size = a + b + c + d + e + f;
            XLANG_ASSERT(m_row_size < UINT8_MAX);

            m_columns[0] = { 0, a };
            if (b) { m_columns[1] = { static_cast<uint8_t>(a), b }; }
            if (c) { m_columns[2] = { static_cast<uint8_t>(a + b), c }; }
            if (d) { m_columns[3] = { static_cast<uint8_t>(a + b + c), d }; }
            if (e) { m_columns[4] = { static_cast<uint8_t>(a + b + c + d), e }; }
            if (f) { m_columns[5] = { static_cast<uint8_t>(a + b + c + d + e), f }; }
        }